

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  unsigned_short *puVar1;
  ImWchar IVar2;
  int iVar3;
  ImWchar *pIVar4;
  ImWchar *in_text;
  long lVar5;
  
  lVar5 = (long)pos;
  in_text = (obj->TextW).Data + lVar5;
  obj->Edited = true;
  iVar3 = ImTextCountUtf8BytesFromStr(in_text,in_text + n);
  obj->CurLenA = obj->CurLenA - iVar3;
  obj->CurLenW = obj->CurLenW - n;
  puVar1 = (obj->TextW).Data;
  IVar2 = puVar1[lVar5 + n];
  if (IVar2 != 0) {
    pIVar4 = puVar1 + n + lVar5;
    do {
      pIVar4 = pIVar4 + 1;
      *in_text = IVar2;
      in_text = in_text + 1;
      IVar2 = *pIVar4;
    } while (IVar2 != 0);
  }
  *in_text = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->Edited = true;
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}